

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::node_output_simple
               (xml_buffered_writer *writer,xml_node_struct *node,uint flags)

{
  char_t cVar1;
  uint *__n;
  size_t sVar2;
  void *__buf;
  size_t sVar3;
  long lVar4;
  void *__buf_00;
  void *extraout_RDX;
  void *__buf_01;
  char_t *pcVar5;
  char_t *pcVar6;
  char_t *pcVar7;
  ulong uVar8;
  
  __n = &switchD_0010ed31::switchdataD_00114300;
  switch((uint)node->header & 0xf) {
  case 3:
    pcVar5 = "";
    if (node->value != (char_t *)0x0) {
      pcVar5 = node->value;
    }
    text_output(writer,pcVar5,ctx_special_pcdata,flags);
    return;
  case 4:
    pcVar5 = "";
    if (node->value != (char_t *)0x0) {
      pcVar5 = node->value;
    }
LAB_0010ef2b:
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x5b);
    xml_buffered_writer::write(writer,0x41,(void *)0x54,0x41);
    lVar4 = 0;
    pcVar7 = pcVar5;
    do {
      cVar1 = *pcVar7;
      if (cVar1 == ']') {
        if ((pcVar7[1] == ']') && (pcVar7[2] == '>')) goto LAB_0010ef81;
      }
      else if (cVar1 == '\0') goto LAB_0010ef81;
      pcVar7 = pcVar7 + 1;
      lVar4 = lVar4 + 1;
    } while( true );
  case 5:
    pcVar5 = "";
    if (node->value != (char_t *)0x0) {
      pcVar5 = node->value;
    }
    sVar2 = 0x2d;
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x2d);
LAB_0010ede3:
    cVar1 = *pcVar5;
    if (cVar1 == '\0') {
      xml_buffered_writer::write(writer,0x2d,(void *)0x2d,0x3e);
      return;
    }
    sVar3 = 0;
    pcVar7 = pcVar5;
    do {
      pcVar6 = pcVar7 + 1;
      if (cVar1 == '-') {
        cVar1 = *pcVar6;
        if ((cVar1 == '\0') || (cVar1 == '-')) goto LAB_0010ee1b;
      }
      else {
        if (cVar1 == '\0') goto LAB_0010ee1b;
        cVar1 = *pcVar6;
      }
      sVar3 = sVar3 + 1;
      pcVar7 = pcVar6;
    } while( true );
  case 6:
    xml_buffered_writer::write(writer,0x3c,(void *)0x3f,0x114300);
    pcVar5 = (char_t *)":anonymous";
    if (node->name != (char_t *)0x0) {
      pcVar5 = node->name;
    }
    xml_buffered_writer::write_string(writer,pcVar5);
    if (node->value != (char_t *)0x0) {
      xml_buffered_writer::write(writer,0x20,__buf,(size_t)__n);
      pcVar5 = node->value;
LAB_0010ee9e:
      cVar1 = *pcVar5;
      if (cVar1 != '\0') {
        pcVar7 = pcVar5 + 2;
        sVar3 = 0;
        do {
          if (cVar1 == '?') {
            cVar1 = pcVar7[-1];
            if (cVar1 == '>') goto LAB_0010eed1;
          }
          else {
            if (cVar1 == '\0') goto LAB_0010eed1;
            cVar1 = pcVar7[-1];
          }
          pcVar7 = pcVar7 + 1;
          sVar3 = sVar3 + 1;
        } while( true );
      }
      break;
    }
    break;
  case 7:
    xml_buffered_writer::write(writer,0x3c,(void *)0x3f,0x114300);
    pcVar5 = (char_t *)":anonymous";
    if (node->name != (char_t *)0x0) {
      pcVar5 = node->name;
    }
    xml_buffered_writer::write_string(writer,pcVar5);
    __n = (uint *)0x0;
    node_output_attributes(writer,node,"",0,flags | 4,0);
    break;
  case 8:
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x44);
    sVar2 = 0x50;
    xml_buffered_writer::write(writer,0x54,(void *)0x59,0x50);
    __buf_01 = __buf_00;
    if (node->value != (char_t *)0x0) {
      xml_buffered_writer::write(writer,0x20,__buf_00,sVar2);
      xml_buffered_writer::write_string(writer,node->value);
      __buf_01 = extraout_RDX;
    }
    xml_buffered_writer::write(writer,0x3e,__buf_01,sVar2);
    return;
  default:
    __assert_fail("false && \"Invalid node type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x1082,
                  "void pugi::impl::(anonymous namespace)::node_output_simple(xml_buffered_writer &, xml_node_struct *, unsigned int)"
                 );
  }
  xml_buffered_writer::write(writer,0x3f,(void *)0x3e,(size_t)__n);
  return;
LAB_0010eed1:
  xml_buffered_writer::write_buffer(writer,pcVar5,sVar3);
  if (pcVar7[-2] == '?') {
    if (pcVar7[-1] != '>') goto LAB_0010f06e;
    __n = (uint *)0x3e;
    xml_buffered_writer::write(writer,0x3f,(void *)0x20,0x3e);
    pcVar5 = pcVar7;
  }
  else {
    pcVar5 = pcVar7 + -2;
    if (pcVar7[-2] != '\0') {
LAB_0010f06e:
      __assert_fail("s[0] == \'?\' && s[1] == \'>\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0xfe2,
                    "void pugi::impl::(anonymous namespace)::node_output_pi_value(xml_buffered_writer &, const char_t *)"
                   );
    }
  }
  goto LAB_0010ee9e;
LAB_0010ee1b:
  xml_buffered_writer::write_buffer(writer,pcVar5,sVar3);
  if (*pcVar7 == '-') {
    xml_buffered_writer::write(writer,0x2d,(void *)0x20,sVar2);
    pcVar5 = pcVar6;
  }
  else {
    pcVar5 = pcVar7;
    if (*pcVar7 != '\0') {
      __assert_fail("*s == \'-\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0xfcb,
                    "void pugi::impl::(anonymous namespace)::node_output_comment(xml_buffered_writer &, const char_t *)"
                   );
    }
  }
  goto LAB_0010ede3;
LAB_0010ef81:
  uVar8 = (ulong)((uint)(cVar1 != '\0') * 2);
  xml_buffered_writer::write_buffer(writer,pcVar5,lVar4 + uVar8);
  xml_buffered_writer::write(writer,0x5d,(void *)0x5d,0x3e);
  pcVar5 = pcVar7 + uVar8;
  if (pcVar7[uVar8] == '\0') {
    return;
  }
  goto LAB_0010ef2b;
}

Assistant:

PUGI__FN void node_output_simple(xml_buffered_writer& writer, xml_node_struct* node, unsigned int flags)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");

		switch (PUGI__NODETYPE(node))
		{
			case node_pcdata:
				text_output(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""), ctx_special_pcdata, flags);
				break;

			case node_cdata:
				text_output_cdata(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""));
				break;

			case node_comment:
				node_output_comment(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""));
				break;

			case node_pi:
				writer.write('<', '?');
				writer.write_string(node->name ? node->name + 0 : default_name);

				if (node->value)
				{
					writer.write(' ');
					node_output_pi_value(writer, node->value);
				}

				writer.write('?', '>');
				break;

			case node_declaration:
				writer.write('<', '?');
				writer.write_string(node->name ? node->name + 0 : default_name);
				node_output_attributes(writer, node, PUGIXML_TEXT(""), 0, flags | format_raw, 0);
				writer.write('?', '>');
				break;

			case node_doctype:
				writer.write('<', '!', 'D', 'O', 'C');
				writer.write('T', 'Y', 'P', 'E');

				if (node->value)
				{
					writer.write(' ');
					writer.write_string(node->value);
				}

				writer.write('>');
				break;

			default:
				assert(false && "Invalid node type"); // unreachable
		}
	}